

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

bool __thiscall QRenderRule::baseStyleCanDraw(QRenderRule *this)

{
  bool bVar1;
  BrushStyle BVar2;
  ulong uVar3;
  QRenderRule *in_RDI;
  QRenderRule *unaff_retaddr;
  QRenderRule *this_00;
  bool local_1;
  
  this_00 = in_RDI;
  bVar1 = hasBackground(unaff_retaddr);
  if (bVar1) {
    background((QRenderRule *)0x44d53a);
    BVar2 = QBrush::style((QBrush *)0x44d546);
    if (BVar2 == NoBrush) {
      QSharedDataPointer<QStyleSheetBackgroundData>::operator->
                ((QSharedDataPointer<QStyleSheetBackgroundData> *)0x44d558);
      uVar3 = QPixmap::isNull();
      if ((uVar3 & 1) != 0) goto LAB_0044d56a;
    }
    bVar1 = ::QSharedDataPointer::operator_cast_to_bool
                      ((QSharedDataPointer<QStyleSheetBackgroundData> *)0x44d57e);
    if (bVar1) {
      QSharedDataPointer<QStyleSheetBackgroundData>::operator->
                ((QSharedDataPointer<QStyleSheetBackgroundData> *)0x44d591);
      uVar3 = QPixmap::isNull();
      if ((uVar3 & 1) == 0) {
        return false;
      }
    }
    bVar1 = hasGradientBackground(this_00);
    if (bVar1) {
      local_1 = (in_RDI->features & 2U) != 0;
    }
    else {
      local_1 = (in_RDI->features & 1U) != 0;
    }
  }
  else {
LAB_0044d56a:
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool baseStyleCanDraw() const {
        if (!hasBackground() || (background()->brush.style() == Qt::NoBrush && bg->pixmap.isNull()))
            return true;
        if (bg && !bg->pixmap.isNull())
            return false;
        if (hasGradientBackground())
            return features & StyleFeature_BackgroundGradient;
        return features & StyleFeature_BackgroundColor;
    }